

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSTEI_HRR_Algorithm_Base.cpp
# Opt level: O2

QAMSet * __thiscall
OSTEI_HRR_Algorithm_Base::GetIntermediates
          (QAMSet *__return_storage_ptr__,OSTEI_HRR_Algorithm_Base *this)

{
  _Rb_tree_header *p_Var1;
  pointer pQVar2;
  bool bVar3;
  size_type sVar4;
  QAM *it;
  pointer __x;
  
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  __x = (this->amorder_).super__Vector_base<QAM,_std::allocator<QAM>_>._M_impl.
        super__Vector_impl_data._M_start;
  pQVar2 = (this->amorder_).super__Vector_base<QAM,_std::allocator<QAM>_>._M_impl.
           super__Vector_impl_data._M_finish;
  do {
    if (__x == pQVar2) {
      return __return_storage_ptr__;
    }
    sVar4 = std::set<QAM,_std::less<QAM>,_std::allocator<QAM>_>::count(&this->topqam_,__x);
    if (sVar4 == 0) {
      if ((this->info_).super_GeneratorInfoBase.deriv_ < 1) {
        bVar3 = QAM::operator==(__x,&(this->info_).super_GeneratorInfoBase.finalam_);
        if (bVar3) goto LAB_00112c8e;
      }
      std::_Rb_tree<QAM,QAM,std::_Identity<QAM>,std::less<QAM>,std::allocator<QAM>>::
      _M_insert_unique<QAM_const&>
                ((_Rb_tree<QAM,QAM,std::_Identity<QAM>,std::less<QAM>,std::allocator<QAM>> *)
                 __return_storage_ptr__,__x);
    }
LAB_00112c8e:
    __x = __x + 1;
  } while( true );
}

Assistant:

QAMSet OSTEI_HRR_Algorithm_Base::GetIntermediates(void) const
{
    QAMSet ret;
    for(const auto & it : amorder_)
    {
        if(!topqam_.count(it) && (info_.Deriv() > 0 || !info_.IsFinalAM(it)))
            ret.insert(it);
    }

    return ret;
}